

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec,xmlChar *value,void *data)

{
  uint uVar1;
  xmlRegInputTokenPtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar1 = exec->inputStackMax;
  if (exec->inputStackNr + 1 < (int)uVar1) {
LAB_0017823e:
    if (value == (xmlChar *)0x0) {
      pxVar2 = exec->inputStack;
      iVar4 = exec->inputStackNr;
      lVar7 = (long)iVar4;
      pxVar2[lVar7].value = (xmlChar *)0x0;
    }
    else {
      pxVar3 = xmlStrdup(value);
      pxVar2 = exec->inputStack;
      iVar4 = exec->inputStackNr;
      lVar7 = (long)iVar4;
      pxVar2[lVar7].value = pxVar3;
      if (pxVar3 == (xmlChar *)0x0) goto LAB_00178265;
    }
    pxVar2[lVar7].data = data;
    exec->inputStackNr = iVar4 + 1;
    pxVar2[(long)iVar4 + 1].value = (xmlChar *)0x0;
    pxVar2[(long)iVar4 + 1].data = (void *)0x0;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
LAB_0017821f:
      pxVar2 = (xmlRegInputTokenPtr)(*xmlRealloc)(exec->inputStack,(ulong)uVar6 << 4);
      if (pxVar2 != (xmlRegInputTokenPtr)0x0) {
        exec->inputStack = pxVar2;
        exec->inputStackMax = uVar6;
        goto LAB_0017823e;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar5 = uVar1 + 1 >> 1;
      uVar6 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar6 = 1000000000;
      }
      goto LAB_0017821f;
    }
LAB_00178265:
    exec->status = -5;
  }
  return;
}

Assistant:

static void
xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                    void *data) {
    if (exec->inputStackNr + 1 >= exec->inputStackMax) {
	xmlRegInputTokenPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(exec->inputStackMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (newSize < 2)
            newSize = 2;
#endif
	tmp = xmlRealloc(exec->inputStack, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->inputStack = tmp;
	exec->inputStackMax = newSize;
    }
    if (value == NULL) {
        exec->inputStack[exec->inputStackNr].value = NULL;
    } else {
        exec->inputStack[exec->inputStackNr].value = xmlStrdup(value);
        if (exec->inputStack[exec->inputStackNr].value == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
            return;
        }
    }
    exec->inputStack[exec->inputStackNr].data = data;
    exec->inputStackNr++;
    exec->inputStack[exec->inputStackNr].value = NULL;
    exec->inputStack[exec->inputStackNr].data = NULL;
}